

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_legacy.cpp
# Opt level: O1

int is_valid_dma_fd(int fd)

{
  int iVar1;
  int iVar2;
  
  iVar1 = fcntl(fd,3,0);
  iVar2 = fcntl(fd,1,0);
  return (int)(iVar2 != -1 && iVar1 != -1);
}

Assistant:

static int is_valid_dma_fd(int fd)
{
    int ret = 1;
    /* detect input file handle */
    int fs_flag = fcntl(fd, F_GETFL, NULL);
    int fd_flag = fcntl(fd, F_GETFD, NULL);

    if (fs_flag == -1 || fd_flag == -1) {
        ret = 0;
    }

    return ret;
}